

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnforcePortSuffix.cpp
# Opt level: O1

bool __thiscall EnforcePortSuffix::check(EnforcePortSuffix *this,RootSymbol *root)

{
  MainVisitor visitor;
  MainVisitor local_38;
  
  local_38.super_TidyVisitor.sourceManager = Registry::getSourceManager();
  local_38.super_TidyVisitor.diags = &(this->super_TidyCheck).diagnostics;
  local_38.super_TidyVisitor.config = Registry::config();
  slang::ast::Symbol::visit<enforce_port_suffix::MainVisitor&>(&root->super_Symbol,&local_38);
  return (this->super_TidyCheck).diagnostics.super_SmallVector<slang::Diagnostic,_2UL>.
         super_SmallVectorBase<slang::Diagnostic>.len == 0;
}

Assistant:

bool check(const ast::RootSymbol& root) override {
        MainVisitor visitor(diagnostics);
        root.visit(visitor);
        return diagnostics.empty();
    }